

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twitch_irc.cpp
# Opt level: O0

void __thiscall twitch_irc::handle_connect(twitch_irc *this,error_code *error,iterator *it)

{
  bool bVar1;
  basic_resolver_entry<boost::asio::ip::tcp> *pbVar2;
  basic_resolver_iterator<boost::asio::ip::tcp> *other;
  ostream *this_00;
  int __fd;
  error_code local_1a0 [2];
  code *local_180;
  undefined8 local_178;
  basic_resolver_iterator<boost::asio::ip::tcp> local_170;
  bind_t<void,_boost::_mfi::mf2<void,_twitch_irc,_const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>,_boost::_bi::list3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>_>
  local_150;
  endpoint_type local_11c;
  undefined1 local_100 [8];
  basic_resolver_entry<boost::asio::ip::tcp> endpoint;
  bind_t<void,_boost::_mfi::mf1<void,_twitch_irc,_const_boost::system::error_code_&>,_boost::_bi::list2<boost::_bi::value<twitch_irc_*>,_boost::arg<1>_>_>
  local_70;
  allocator local_41;
  string local_40 [32];
  iterator *local_20;
  iterator *it_local;
  error_code *error_local;
  twitch_irc *this_local;
  undefined1 *this_01;
  
  local_20 = it;
  it_local = (iterator *)error;
  error_local = (error_code *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool(error);
  if (bVar1) {
    this_01 = &endpoint.field_0x58;
    boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::basic_resolver_iterator
              ((basic_resolver_iterator<boost::asio::ip::tcp> *)this_01);
    bVar1 = boost::asio::ip::operator!=(it,(basic_resolver_iterator<boost::asio::ip::tcp> *)this_01)
    ;
    __fd = (int)this_01;
    boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::~basic_resolver_iterator
              ((basic_resolver_iterator<boost::asio::ip::tcp> *)&endpoint.field_0x58);
    if (bVar1) {
      boost::asio::
      basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::close(&(this->socket).
               super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ,__fd);
      pbVar2 = boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::operator*(it);
      boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>::basic_resolver_entry
                ((basic_resolver_entry<boost::asio::ip::tcp> *)local_100,pbVar2);
      boost::asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint
                (&local_11c,(basic_resolver_entry *)local_100);
      other = boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::operator++(it);
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::basic_resolver_iterator
                (&local_170,other);
      local_180 = handle_connect;
      local_178 = 0;
      boost::
      bind<void,twitch_irc,boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,twitch_irc*,boost::arg<1>,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>
                (&local_150,(boost *)handle_connect,0,this,&local_170);
      boost::asio::
      basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::
      async_connect<boost::_bi::bind_t<void,boost::_mfi::mf2<void,twitch_irc,boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>,boost::_bi::list3<boost::_bi::value<twitch_irc*>,boost::arg<1>,boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>>>>
                ((basic_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)&this->socket,&local_11c,&local_150);
      boost::_bi::
      bind_t<void,_boost::_mfi::mf2<void,_twitch_irc,_const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>,_boost::_bi::list3<boost::_bi::value<twitch_irc_*>,_boost::arg<1>,_boost::_bi::value<boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>_>_>_>
      ::~bind_t(&local_150);
      boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::~basic_resolver_iterator
                (&local_170);
      boost::asio::ip::basic_resolver_entry<boost::asio::ip::tcp>::~basic_resolver_entry
                ((basic_resolver_entry<boost::asio::ip::tcp> *)local_100);
    }
    else {
      boost::system::error_code::message_abi_cxx11_(local_1a0);
      this_00 = std::operator<<((ostream *)&std::cerr,(string *)local_1a0);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_1a0);
    }
  }
  else {
    std::function<void_()>::operator()(&this->on_connect);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"\r\n",&local_41);
    boost::bind<void,twitch_irc,boost::system::error_code_const&,twitch_irc*,boost::arg<1>>
              (&local_70,(boost *)read,0,this);
    boost::asio::
    async_read_until<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,std::allocator<char>,boost::_bi::bind_t<void,boost::_mfi::mf1<void,twitch_irc,boost::system::error_code_const&>,boost::_bi::list2<boost::_bi::value<twitch_irc*>,boost::arg<1>>>>
              (&this->socket,&this->read_buffer,(string *)local_40,&local_70);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

void twitch_irc::handle_connect(const boost::system::error_code &error, tcp::resolver::iterator it)
{
    if (!error) {
        on_connect();
        boost::asio::async_read_until(socket, read_buffer, "\r\n",
                                      bind(&twitch_irc::read, this, _1));
    } else if (it != tcp::resolver::iterator()) {
        socket.close();
        auto endpoint = *it;
        socket.async_connect(endpoint,
                             bind(&twitch_irc::handle_connect, this, _1, ++it));
    } else {
        cerr << error.message() << endl;
    }

}